

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse
          (Impl *this,StateCreatorInterface *iface,DatabaseInterface *resolver,void *buffer_,
          size_t total_size)

{
  uchar *puVar1;
  uint uVar2;
  DatabaseInterface *resolver_00;
  Impl *this_00;
  StateCreatorInterface *iface_00;
  bool bVar3;
  bool bVar4;
  uchar *puVar5;
  Type pGVar6;
  Type pdf_info;
  Ch *__nptr;
  ulonglong uVar7;
  ParseErrorCode error;
  Impl *this_01;
  uchar *puVar8;
  uchar *varint;
  long *in_FS_OFFSET;
  undefined1 local_c0 [8];
  undefined8 local_b8;
  ulong uStack_b0;
  undefined8 *local_a8;
  undefined8 *puStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 local_70;
  uint local_68;
  undefined8 local_60;
  uchar *local_50;
  DatabaseInterface *local_48;
  Impl *local_40;
  StateCreatorInterface *local_38;
  
  puVar8 = (uchar *)(total_size + (long)buffer_);
  local_b8 = local_b8 & 0xffffffffffffff00;
  local_48 = resolver;
  local_40 = this;
  local_38 = iface;
  puVar5 = std::__find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                     (buffer_,puVar8,local_c0 + 8);
  local_50 = puVar5 + -(long)buffer_;
  varint = puVar5 + 1;
  puVar1 = puVar8 + -(long)(puVar5 + 1);
  if (puVar8 <= puVar5) {
    varint = (uchar *)0x0;
    puVar1 = (uchar *)0x0;
  }
  local_78 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = (undefined8 *)0x0;
  puStack_a0 = (undefined8 *)0x0;
  local_b8 = (Ch *)0x0;
  uStack_b0 = 0;
  local_70 = 0x400;
  local_68 = 0;
  local_60 = 0;
  local_a8 = (undefined8 *)operator_new(0x28);
  *local_a8 = 0;
  local_a8[1] = 0x10000;
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_a8[4] = 0;
  puStack_a0 = local_a8;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
  ::Parse<0u,rapidjson::UTF8<char>>
            ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
              *)(local_c0 + 8),(Ch *)buffer_,(size_t)local_50);
  iface_00 = local_38;
  this_00 = local_40;
  uVar2 = local_68;
  if (local_68 == 0) {
    local_50 = puVar1;
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)(local_c0 + 8),"version");
    if ((undefined1  [16])((undefined1  [16])pGVar6->data_ & (undefined1  [16])0x20000000000000) ==
        (undefined1  [16])0x0) {
      __assert_fail("data_.f.flags & kIntFlag",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                    ,0x718,
                    "int rapidjson::GenericValue<rapidjson::UTF8<>>::GetInt() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                   );
    }
    if (0xfffffffd < (pGVar6->data_).s.length - 7) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_c0,local_c0 + 8);
      if (uStack_b0._6_2_ != 3) goto LAB_0011542a;
      if (local_c0 !=
          (undefined1  [8])((local_b8 & 0xffffffff) * 0x20 + (uStack_b0 & 0xffffffffffff))) {
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)local_c0,local_c0 + 8);
        if (uStack_b0._6_2_ != 3) goto LAB_0011542a;
        if (local_c0 !=
            (undefined1  [8])((local_b8 & 0xffffffff) * 0x20 + (uStack_b0 & 0xffffffffffff))) {
          pGVar6 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)(local_c0 + 8),"applicationInfo");
          pdf_info = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                     ::operator[]<char_const>
                               ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                 *)(local_c0 + 8),"physicalDeviceFeatures");
          bVar4 = parse_application_info(this_00,iface_00,pGVar6,pdf_info);
          if (!bVar4) goto LAB_0011540a;
        }
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_c0,local_c0 + 8);
      if (uStack_b0._6_2_ != 3) goto LAB_0011542a;
      if (local_c0 !=
          (undefined1  [8])((local_b8 & 0xffffffff) * 0x20 + (uStack_b0 & 0xffffffffffff))) {
        pGVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)(local_c0 + 8),"application");
        __nptr = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(pGVar6);
        uVar7 = strtoull(__nptr,(char **)0x0,0x10);
        (*iface_00->_vptr_StateCreatorInterface[3])(iface_00,uVar7);
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_c0,local_c0 + 8);
      if (uStack_b0._6_2_ != 3) goto LAB_0011542a;
      if (local_c0 !=
          (undefined1  [8])((local_b8 & 0xffffffff) * 0x20 + (uStack_b0 & 0xffffffffffff))) {
        this_01 = (Impl *)(local_c0 + 8);
        pGVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)this_01,"link");
        parse_application_info_link(this_01,iface_00,pGVar6);
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_c0,local_c0 + 8);
      puVar1 = local_50;
      if (uStack_b0._6_2_ != 3) goto LAB_0011542a;
      if (local_c0 !=
          (undefined1  [8])((local_b8 & 0xffffffff) * 0x20 + (uStack_b0 & 0xffffffffffff))) {
        pGVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)(local_c0 + 8),"shaderModules");
        bVar4 = parse_shader_modules(this_00,iface_00,pGVar6,varint,(size_t)puVar1);
        if (!bVar4) goto LAB_0011540a;
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_c0,local_c0 + 8);
      resolver_00 = local_48;
      if (uStack_b0._6_2_ != 3) goto LAB_0011542a;
      if (local_c0 !=
          (undefined1  [8])((local_b8 & 0xffffffff) * 0x20 + (uStack_b0 & 0xffffffffffff))) {
        pGVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)(local_c0 + 8),"samplers");
        bVar4 = parse_samplers(this_00,iface_00,pGVar6);
        if (!bVar4) goto LAB_0011540a;
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_c0,local_c0 + 8);
      if (uStack_b0._6_2_ != 3) goto LAB_0011542a;
      if (local_c0 !=
          (undefined1  [8])((local_b8 & 0xffffffff) * 0x20 + (uStack_b0 & 0xffffffffffff))) {
        pGVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)(local_c0 + 8),"setLayouts");
        bVar4 = parse_descriptor_set_layouts(this_00,iface_00,resolver_00,pGVar6);
        if (!bVar4) goto LAB_0011540a;
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_c0,local_c0 + 8);
      if (uStack_b0._6_2_ != 3) goto LAB_0011542a;
      if (local_c0 !=
          (undefined1  [8])((local_b8 & 0xffffffff) * 0x20 + (uStack_b0 & 0xffffffffffff))) {
        pGVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)(local_c0 + 8),"pipelineLayouts");
        bVar4 = parse_pipeline_layouts(this_00,iface_00,pGVar6);
        if (!bVar4) goto LAB_0011540a;
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_c0,local_c0 + 8);
      if (uStack_b0._6_2_ != 3) goto LAB_0011542a;
      if (local_c0 !=
          (undefined1  [8])((local_b8 & 0xffffffff) * 0x20 + (uStack_b0 & 0xffffffffffff))) {
        pGVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)(local_c0 + 8),"renderPasses");
        bVar4 = parse_render_passes(this_00,iface_00,pGVar6);
        if (!bVar4) goto LAB_0011540a;
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_c0,local_c0 + 8);
      if (uStack_b0._6_2_ != 3) goto LAB_0011542a;
      if (local_c0 !=
          (undefined1  [8])((local_b8 & 0xffffffff) * 0x20 + (uStack_b0 & 0xffffffffffff))) {
        pGVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)(local_c0 + 8),"renderPasses2");
        bVar4 = parse_render_passes2(this_00,iface_00,pGVar6);
        if (!bVar4) goto LAB_0011540a;
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_c0,local_c0 + 8);
      if (uStack_b0._6_2_ != 3) goto LAB_0011542a;
      if (local_c0 !=
          (undefined1  [8])((local_b8 & 0xffffffff) * 0x20 + (uStack_b0 & 0xffffffffffff))) {
        pGVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)(local_c0 + 8),"computePipelines");
        bVar4 = parse_compute_pipelines(this_00,iface_00,resolver_00,pGVar6);
        if (!bVar4) goto LAB_0011540a;
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_c0,local_c0 + 8);
      if (uStack_b0._6_2_ != 3) goto LAB_0011542a;
      if (local_c0 !=
          (undefined1  [8])((local_b8 & 0xffffffff) * 0x20 + (uStack_b0 & 0xffffffffffff))) {
        pGVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)(local_c0 + 8),"graphicsPipelines");
        bVar4 = parse_graphics_pipelines(this_00,iface_00,resolver_00,pGVar6);
        if (!bVar4) goto LAB_0011540a;
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_c0,local_c0 + 8);
      if (uStack_b0._6_2_ != 3) {
LAB_0011542a:
        __assert_fail("IsObject()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                      ,0x4db,
                      "ConstMemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::MemberEnd() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                     );
      }
      if (local_c0 !=
          (undefined1  [8])((local_b8 & 0xffffffff) * 0x20 + (uStack_b0 & 0xffffffffffff))) {
        pGVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)(local_c0 + 8),"raytracingPipelines");
        bVar4 = parse_raytracing_pipelines(this_00,iface_00,resolver_00,pGVar6);
        if (!bVar4) goto LAB_0011540a;
      }
      bVar4 = true;
      goto LAB_0011540c;
    }
    if (*(int *)(*in_FS_OFFSET + -0x18) < 3) {
      bVar4 = false;
      bVar3 = Internal::log_thread_callback(LOG_ERROR,"JSON version mismatches.");
      if (bVar3) goto LAB_0011540c;
      parse();
    }
  }
  else if (*(int *)(*in_FS_OFFSET + -0x18) < 3) {
    bVar4 = false;
    bVar3 = Internal::log_thread_callback(LOG_ERROR,"Got parse error: %d\n",(ulong)local_68);
    if (!bVar3) {
      bVar4 = false;
      fprintf(_stderr,"Fossilize ERROR: Got parse error: %d\n",(ulong)uVar2);
    }
    goto LAB_0011540c;
  }
LAB_0011540a:
  bVar4 = false;
LAB_0011540c:
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)(local_c0 + 8));
  return bVar4;
}

Assistant:

bool StateReplayer::Impl::parse(StateCreatorInterface &iface, DatabaseInterface *resolver, const void *buffer_, size_t total_size)
{
	// All data after a string terminating '\0' is considered binary payload
	// which can be read for various purposes (SPIR-V varint for example).
	const uint8_t *buffer = static_cast<const uint8_t *>(buffer_);
	auto itr = find(buffer, buffer + total_size, '\0');
	const uint8_t *varint_buffer = nullptr;
	size_t varint_size = 0;
	size_t json_size = itr - buffer;

	if (itr < buffer + total_size)
	{
		varint_buffer = itr + 1;
		varint_size = (buffer + total_size) - varint_buffer;
	}

	Document doc;
	doc.Parse(reinterpret_cast<const char *>(buffer), json_size);

	if (doc.HasParseError())
	{
		auto error = doc.GetParseError();
		LOGE_LEVEL("Got parse error: %d\n", int(error));
		return false;
	}

	int version = doc["version"].GetInt();
	if (version > FOSSILIZE_FORMAT_VERSION || version < FOSSILIZE_FORMAT_MIN_COMPAT_VERSION)
	{
		LOGE_LEVEL("JSON version mismatches.");
		return false;
	}

	if (doc.HasMember("applicationInfo") && doc.HasMember("physicalDeviceFeatures"))
		if (!parse_application_info(iface, doc["applicationInfo"], doc["physicalDeviceFeatures"]))
			return false;

	if (doc.HasMember("application"))
		iface.set_current_application_info(string_to_uint64(doc["application"].GetString()));

	if (doc.HasMember("link"))
		if (!parse_application_info_link(iface, doc["link"]))
			return false;

	if (doc.HasMember("shaderModules"))
		if (!parse_shader_modules(iface, doc["shaderModules"], varint_buffer, varint_size))
			return false;

	if (doc.HasMember("samplers"))
		if (!parse_samplers(iface, doc["samplers"]))
			return false;

	if (doc.HasMember("setLayouts"))
		if (!parse_descriptor_set_layouts(iface, resolver, doc["setLayouts"]))
			return false;

	if (doc.HasMember("pipelineLayouts"))
		if (!parse_pipeline_layouts(iface, doc["pipelineLayouts"]))
			return false;

	if (doc.HasMember("renderPasses"))
		if (!parse_render_passes(iface, doc["renderPasses"]))
			return false;

	if (doc.HasMember("renderPasses2"))
		if (!parse_render_passes2(iface, doc["renderPasses2"]))
			return false;

	if (doc.HasMember("computePipelines"))
		if (!parse_compute_pipelines(iface, resolver, doc["computePipelines"]))
			return false;

	if (doc.HasMember("graphicsPipelines"))
		if (!parse_graphics_pipelines(iface, resolver, doc["graphicsPipelines"]))
			return false;

	if (doc.HasMember("raytracingPipelines"))
		if (!parse_raytracing_pipelines(iface, resolver, doc["raytracingPipelines"]))
			return false;

	return true;
}